

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O2

void __thiscall
HighsLinearSumBounds::updatedImplVarLower
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient,
          double oldImplVarLower,HighsInt oldImplVarLowerSource)

{
  int *piVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  HighsCDouble *this_00;
  double dVar5;
  double local_20;
  
  local_20 = oldImplVarLower;
  pdVar3 = this->varLower;
  pdVar4 = pdVar3 + var;
  if ((oldImplVarLowerSource != sum) && (*pdVar4 <= oldImplVarLower)) {
    pdVar4 = &local_20;
  }
  dVar2 = *pdVar4;
  if (this->implVarLowerSource[var] == sum) {
    dVar5 = pdVar3[var];
  }
  else {
    dVar5 = pdVar3[var];
    if (pdVar3[var] <= this->implVarLower[var]) {
      dVar5 = this->implVarLower[var];
    }
  }
  if ((dVar5 != dVar2) || (NAN(dVar5) || NAN(dVar2))) {
    if (coefficient <= 0.0) {
      if (-INFINITY < dVar2) {
        HighsCDouble::operator-=
                  ((this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                   _M_impl.super__Vector_impl_data._M_start + sum,dVar2 * coefficient);
      }
      else {
        piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + -1;
      }
      if (-INFINITY < dVar5) {
        this_00 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                  _M_impl.super__Vector_impl_data._M_start + sum;
        goto LAB_0035e542;
      }
      piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
    }
    else {
      if (-INFINITY < dVar2) {
        HighsCDouble::operator-=
                  ((this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                   _M_impl.super__Vector_impl_data._M_start + sum,dVar2 * coefficient);
      }
      else {
        piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + -1;
      }
      if (-INFINITY < dVar5) {
        this_00 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                  _M_impl.super__Vector_impl_data._M_start + sum;
LAB_0035e542:
        HighsCDouble::operator+=(this_00,dVar5 * coefficient);
        return;
      }
      piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
    }
  }
  return;
}

Assistant:

void HighsLinearSumBounds::updatedImplVarLower(HighsInt sum, HighsInt var,
                                               double coefficient,
                                               double oldImplVarLower,
                                               HighsInt oldImplVarLowerSource) {
  double oldVLower = oldImplVarLowerSource == sum
                         ? varLower[var]
                         : std::max(oldImplVarLower, varLower[var]);

  double vLower = implVarLowerSource[var] == sum
                      ? varLower[var]
                      : std::max(implVarLower[var], varLower[var]);

  if (vLower == oldVLower) return;

  if (coefficient > 0) {
    if (oldVLower == -kHighsInf)
      numInfSumLower[sum] -= 1;
    else
      sumLower[sum] -= oldVLower * coefficient;

    if (vLower == -kHighsInf)
      numInfSumLower[sum] += 1;
    else
      sumLower[sum] += vLower * coefficient;

  } else {
    if (oldVLower == -kHighsInf)
      numInfSumUpper[sum] -= 1;
    else
      sumUpper[sum] -= oldVLower * coefficient;

    if (vLower == -kHighsInf)
      numInfSumUpper[sum] += 1;
    else
      sumUpper[sum] += vLower * coefficient;
  }
}